

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_treenode.cc
# Opt level: O0

NodePtr __thiscall dh::TreeNode::getSibling(TreeNode *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  NodePtr NVar1;
  TreeNode *this_local;
  
  std::shared_ptr<dh::TreeNode>::shared_ptr
            ((shared_ptr<dh::TreeNode> *)this,(shared_ptr<dh::TreeNode> *)(in_RSI + 0x18));
  NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (NodePtr)NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr TreeNode::getSibling() const
{
	return this->_sibling;
}